

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

void __thiscall adiosStream::defineADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  bool bVar1;
  string *psVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  long in_RDI;
  Variable<int> v_2;
  Variable<float> v_1;
  Variable<double> v;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1348cb
            );
  bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1348ff);
    peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13490e);
    peVar5 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x134921);
    peVar6 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x134936);
    adios2::IO::DefineVariable<double>
              ((string *)(in_RDI + 0x38),(vector *)peVar3,(vector *)&peVar4->shape,
               (vector *)&peVar5->start,(bool)((char)peVar6 + -0x68));
  }
  else {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134976);
    bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1349aa);
      peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1349b9);
      peVar5 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1349cc);
      peVar6 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1349e1);
      adios2::IO::DefineVariable<float>
                ((string *)(in_RDI + 0x38),(vector *)peVar3,(vector *)&peVar4->shape,
                 (vector *)&peVar5->start,(bool)((char)peVar6 + -0x68));
    }
    else {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134a21);
      bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        psVar2 = (string *)(in_RDI + 0x38);
        peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134a55);
        peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134a64);
        peVar5 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134a77);
        peVar6 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134a8c);
        adios2::IO::DefineVariable<int>
                  (psVar2,(vector *)peVar3,(vector *)&peVar4->shape,(vector *)&peVar5->start,
                   (bool)((char)peVar6 + -0x68));
      }
    }
  }
  return;
}

Assistant:

void adiosStream::defineADIOSArray(const std::shared_ptr<VariableInfo> ov)
{
    if (ov->type == "double")
    {
        adios2::Variable<double> v =
            io.DefineVariable<double>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
        // v = io->InquireVariable<double>(ov->name);
    }
    else if (ov->type == "float")
    {
        adios2::Variable<float> v =
            io.DefineVariable<float>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
    }
    else if (ov->type == "int")
    {
        adios2::Variable<int> v =
            io.DefineVariable<int>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
    }
}